

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O2

void __thiscall DataStream::ignore(DataStream *this,size_t num_ignore)

{
  long lVar1;
  pointer pbVar2;
  pointer pbVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = num_ignore + this->m_read_pos;
  if (!CARRY8(num_ignore,this->m_read_pos)) {
    pbVar2 = (this->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (this->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar5 = (long)pbVar3 - (long)pbVar2;
    if (uVar6 <= uVar5) {
      if (uVar6 == uVar5) {
        this->m_read_pos = 0;
        if (pbVar3 != pbVar2) {
          (this->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_finish = pbVar2;
        }
      }
      else {
        this->m_read_pos = uVar6;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      goto LAB_001acb34;
    }
  }
  pcVar4 = (char *)__cxa_allocate_exception(0x20);
  std::iostream_category();
  std::ios_base::failure[abi:cxx11]::failure
            (pcVar4,(error_code *)"DataStream::ignore(): end of data");
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
                std::ios_base::failure[abi:cxx11]::~failure);
  }
LAB_001acb34:
  __stack_chk_fail();
}

Assistant:

void ignore(size_t num_ignore)
    {
        // Ignore from the beginning of the buffer
        auto next_read_pos{CheckedAdd(m_read_pos, num_ignore)};
        if (!next_read_pos.has_value() || next_read_pos.value() > vch.size()) {
            throw std::ios_base::failure("DataStream::ignore(): end of data");
        }
        if (next_read_pos.value() == vch.size()) {
            m_read_pos = 0;
            vch.clear();
            return;
        }
        m_read_pos = next_read_pos.value();
    }